

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_config_avoid_method(event_config *cfg,char *method)

{
  event_config_entry *ptr;
  char *pcVar1;
  event_config_entry *entry;
  char *method_local;
  event_config *cfg_local;
  
  ptr = (event_config_entry *)event_mm_malloc_(0x18);
  if (ptr == (event_config_entry *)0x0) {
    cfg_local._4_4_ = -1;
  }
  else {
    pcVar1 = event_mm_strdup_(method);
    ptr->avoid_method = pcVar1;
    if (pcVar1 == (char *)0x0) {
      event_mm_free_(ptr);
      cfg_local._4_4_ = -1;
    }
    else {
      (ptr->next).tqe_next = (event_config_entry *)0x0;
      (ptr->next).tqe_prev = (cfg->entries).tqh_last;
      *(cfg->entries).tqh_last = ptr;
      (cfg->entries).tqh_last = (event_config_entry **)ptr;
      cfg_local._4_4_ = 0;
    }
  }
  return cfg_local._4_4_;
}

Assistant:

int
event_config_avoid_method(struct event_config *cfg, const char *method)
{
	struct event_config_entry *entry = mm_malloc(sizeof(*entry));
	if (entry == NULL)
		return (-1);

	if ((entry->avoid_method = mm_strdup(method)) == NULL) {
		mm_free(entry);
		return (-1);
	}

	TAILQ_INSERT_TAIL(&cfg->entries, entry, next);

	return (0);
}